

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O0

int Cec_ManSatCheckNode(Cec_ManSat_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  abctime aVar7;
  abctime clk2;
  abctime clk;
  int nConflicts;
  int status;
  int RetValue;
  int Lit;
  int nBTLimit;
  Gia_Obj_t *pObjR;
  Gia_Obj_t *pObj_local;
  Cec_ManSat_t *p_local;
  
  pObjR = pObj;
  pObj_local = (Gia_Obj_t *)p;
  _Lit = Gia_Regular(pObj);
  pGVar6 = pObjR;
  RetValue = **(int **)pObj_local;
  pGVar5 = Gia_ManConst0(*(Gia_Man_t **)&pObj_local->Value);
  pGVar1 = pObjR;
  if (pGVar6 == pGVar5) {
    p_local._4_4_ = 1;
  }
  else {
    pGVar6 = Gia_ManConst1(*(Gia_Man_t **)&pObj_local->Value);
    if (pGVar1 == pGVar6) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSolve.c"
                    ,0x1e1,"int Cec_ManSatCheckNode(Cec_ManSat_t *, Gia_Obj_t *)");
    }
    *(int *)(pObj_local + 5) = *(int *)(pObj_local + 5) + 1;
    *(int *)&pObj_local[8].field_0x4 = *(int *)&pObj_local[8].field_0x4 + 1;
    if ((*(long *)(pObj_local + 2) == 0) ||
       (((*(int *)(*(long *)pObj_local + 4) != 0 &&
         (*(int *)(*(long *)pObj_local + 4) < (int)pObj_local[2].Value)) &&
        (*(int *)(*(long *)pObj_local + 8) < *(int *)(pObj_local + 5))))) {
      Cec_ManSatSolverRecycle((Cec_ManSat_t *)pObj_local);
    }
    Abc_Clock();
    Cec_CnfNodeAddToSolver((Cec_ManSat_t *)pObj_local,_Lit);
    Abc_Clock();
    if (*(int *)(*(long *)(pObj_local + 2) + 0xc) != *(int *)(*(long *)(pObj_local + 2) + 8)) {
      iVar2 = sat_solver_simplify(*(sat_solver **)(pObj_local + 2));
      if (iVar2 == 0) {
        __assert_fail("status != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSolve.c"
                      ,0x1fd,"int Cec_ManSatCheckNode(Cec_ManSat_t *, Gia_Obj_t *)");
      }
      if (*(int *)(*(long *)(pObj_local + 2) + 0xc) != *(int *)(*(long *)(pObj_local + 2) + 8)) {
        __assert_fail("p->pSat->qtail == p->pSat->qhead",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSolve.c"
                      ,0x1fe,"int Cec_ManSatCheckNode(Cec_ManSat_t *, Gia_Obj_t *)");
      }
    }
    iVar2 = Cec_ObjSatNum((Cec_ManSat_t *)pObj_local,_Lit);
    iVar3 = Gia_IsComplement(pObjR);
    status = toLitCond(iVar2,iVar3);
    if ((*(int *)(*(long *)pObj_local + 0x10) != 0) && (*(long *)_Lit < 0)) {
      status = lit_neg(status);
    }
    aVar7 = Abc_Clock();
    iVar3 = (int)*(undefined8 *)(*(long *)(pObj_local + 2) + 0x1b8);
    Abc_Clock();
    iVar4 = sat_solver_solve(*(sat_solver **)(pObj_local + 2),&status,&RetValue,(long)RetValue,0,0,0
                            );
    iVar2 = (int)aVar7;
    if (iVar4 == -1) {
      aVar7 = Abc_Clock();
      *(int *)(pObj_local + 10) = *(int *)(pObj_local + 10) + ((int)aVar7 - iVar2);
      status = lit_neg(status);
      iVar2 = sat_solver_addclause(*(sat_solver **)(pObj_local + 2),&status,&RetValue);
      if (iVar2 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSolve.c"
                      ,0x216,"int Cec_ManSatCheckNode(Cec_ManSat_t *, Gia_Obj_t *)");
      }
      *(int *)&pObj_local[7].field_0x4 = *(int *)&pObj_local[7].field_0x4 + 1;
      *(int *)(pObj_local + 9) =
           *(int *)(pObj_local + 9) +
           ((int)*(undefined8 *)(*(long *)(pObj_local + 2) + 0x1b8) - iVar3);
      p_local._4_4_ = 1;
    }
    else if (iVar4 == 1) {
      aVar7 = Abc_Clock();
      *(int *)&pObj_local[10].field_0x4 = *(int *)&pObj_local[10].field_0x4 + ((int)aVar7 - iVar2);
      pObj_local[7].Value = pObj_local[7].Value + 1;
      *(int *)&pObj_local[9].field_0x4 =
           *(int *)&pObj_local[9].field_0x4 +
           ((int)*(undefined8 *)(*(long *)(pObj_local + 2) + 0x1b8) - iVar3);
      p_local._4_4_ = 0;
    }
    else {
      aVar7 = Abc_Clock();
      pObj_local[10].Value = pObj_local[10].Value + ((int)aVar7 - iVar2);
      *(int *)(pObj_local + 8) = *(int *)(pObj_local + 8) + 1;
      pObj_local[9].Value =
           pObj_local[9].Value + ((int)*(undefined8 *)(*(long *)(pObj_local + 2) + 0x1b8) - iVar3);
      p_local._4_4_ = -1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Cec_ManSatCheckNode( Cec_ManSat_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pObjR = Gia_Regular(pObj);
    int nBTLimit = p->pPars->nBTLimit;
    int Lit, RetValue, status, nConflicts;
    abctime clk, clk2;

    if ( pObj == Gia_ManConst0(p->pAig) )
        return 1;
    if ( pObj == Gia_ManConst1(p->pAig) )
    {
        assert( 0 );
        return 0;
    }

    p->nCallsSince++;  // experiment with this!!!
    p->nSatTotal++;
    
    // check if SAT solver needs recycling
    if ( p->pSat == NULL || 
        (p->pPars->nSatVarMax && 
         p->nSatVars > p->pPars->nSatVarMax && 
         p->nCallsSince > p->pPars->nCallsRecycle) )
        Cec_ManSatSolverRecycle( p );

    // if the nodes do not have SAT variables, allocate them
clk2 = Abc_Clock();
    Cec_CnfNodeAddToSolver( p, pObjR );
//ABC_PRT( "cnf", Abc_Clock() - clk2 );
//Abc_Print( 1, "%d \n", p->pSat->size );

clk2 = Abc_Clock();
//    Cec_SetActivityFactors( p, pObjR ); 
//ABC_PRT( "act", Abc_Clock() - clk2 );

    // propage unit clauses
    if ( p->pSat->qtail != p->pSat->qhead )
    {
        status = sat_solver_simplify(p->pSat);
        assert( status != 0 );
        assert( p->pSat->qtail == p->pSat->qhead );
    }

    // solve under assumptions
    // A = 1; B = 0     OR     A = 1; B = 1 
    Lit = toLitCond( Cec_ObjSatNum(p,pObjR), Gia_IsComplement(pObj) );
    if ( p->pPars->fPolarFlip )
    {
        if ( pObjR->fPhase )  Lit = lit_neg( Lit );
    }
//Sat_SolverWriteDimacs( p->pSat, "temp.cnf", pLits, pLits + 2, 1 );
clk = Abc_Clock();
    nConflicts = p->pSat->stats.conflicts;

clk2 = Abc_Clock();
    RetValue = sat_solver_solve( p->pSat, &Lit, &Lit + 1, 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
//ABC_PRT( "sat", Abc_Clock() - clk2 );

    if ( RetValue == l_False )
    {
p->timeSatUnsat += Abc_Clock() - clk;
        Lit = lit_neg( Lit );
        RetValue = sat_solver_addclause( p->pSat, &Lit, &Lit + 1 );
        assert( RetValue );
        p->nSatUnsat++;
        p->nConfUnsat += p->pSat->stats.conflicts - nConflicts;       
//Abc_Print( 1, "UNSAT after %d conflicts\n", p->pSat->stats.conflicts - nConflicts );
        return 1;
    }
    else if ( RetValue == l_True )
    {
p->timeSatSat += Abc_Clock() - clk;
        p->nSatSat++;
        p->nConfSat += p->pSat->stats.conflicts - nConflicts;
//Abc_Print( 1, "SAT after %d conflicts\n", p->pSat->stats.conflicts - nConflicts );
        return 0;
    }
    else // if ( RetValue == l_Undef )
    {
p->timeSatUndec += Abc_Clock() - clk;
        p->nSatUndec++;
        p->nConfUndec += p->pSat->stats.conflicts - nConflicts;
//Abc_Print( 1, "UNDEC after %d conflicts\n", p->pSat->stats.conflicts - nConflicts );
        return -1;
    }
}